

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

int __thiscall CGraphics_Threaded::UnloadTexture(CGraphics_Threaded *this,CTextureHandle *pIndex)

{
  int iVar1;
  long in_FS_OFFSET;
  CTextureDestroyCommand Cmd;
  CTextureDestroyCommand local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = pIndex->m_Id;
  if ((-1 < iVar1) && (iVar1 != (this->m_InvalidTexture).m_Id)) {
    local_30.super_CCommand.m_Cmd = 4;
    local_30.super_CCommand.m_pNext = (CCommand *)0x0;
    local_30.m_Slot = iVar1;
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureDestroyCommand>
              (this->m_pCommandBuffer,&local_30);
    this->m_aTextureIndices[pIndex->m_Id] = this->m_FirstFreeTexture;
    this->m_FirstFreeTexture = pIndex->m_Id;
    pIndex->m_Id = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphics_Threaded::UnloadTexture(CTextureHandle *pIndex)
{
	if(pIndex->Id() == m_InvalidTexture.Id())
		return 0;

	if(!pIndex->IsValid())
		return 0;

	CCommandBuffer::CTextureDestroyCommand Cmd;
	Cmd.m_Slot = pIndex->Id();
	m_pCommandBuffer->AddCommand(Cmd);

	m_aTextureIndices[pIndex->Id()] = m_FirstFreeTexture;
	m_FirstFreeTexture = pIndex->Id();

	pIndex->Invalidate();
	return 0;
}